

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.cpp
# Opt level: O1

QString * UnixUtils::substituteFileBrowserParameters
                    (QString *__return_storage_ptr__,QString *pre,QString *file)

{
  int iVar1;
  char16_t cVar2;
  char16_t *pcVar3;
  QArrayData *pQVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  QString t;
  QString s;
  QString local_a8;
  QArrayData *local_90;
  char16_t *local_88;
  qsizetype qStack_80;
  QArrayData *local_78;
  char16_t *local_70;
  qsizetype qStack_68;
  FileName local_60;
  QString local_48;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar5 = (pre->d).size;
  if (0 < lVar5) {
    lVar6 = 0;
    iVar7 = 0;
    do {
      pcVar3 = (pre->d).ptr;
      if (lVar6 < lVar5 + -1 && pcVar3[lVar6] == L'%') {
        cVar2 = pcVar3[(long)iVar7 + 1];
        local_48.d.d = (Data *)0x0;
        local_48.d.ptr = (char16_t *)0x0;
        local_48.d.size = 0;
        if ((ushort)cVar2 < 0x66) {
          if (cVar2 == L'%') {
            QString::operator=(&local_48,(QChar)0x25);
          }
          else if (cVar2 == L'd') {
            QFileInfo::QFileInfo((QFileInfo *)&local_60,(QString *)file);
            QFileInfo::path();
            QString::QString(&local_a8,(QChar)0x22);
            QString::append((QString *)&local_a8);
            local_90 = &(local_a8.d.d)->super_QArrayData;
            local_88 = local_a8.d.ptr;
            qStack_80 = local_a8.d.size;
            if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
            QString::append((QChar)(char16_t)&local_90);
            QString::operator=(&local_48,(QString *)&local_90);
            if (local_90 != (QArrayData *)0x0) {
              LOCK();
              (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_90,2,8);
              }
            }
            if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
              }
            }
            if (local_78 != (QArrayData *)0x0) {
              LOCK();
              (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_78,2,8);
              }
            }
            QFileInfo::~QFileInfo((QFileInfo *)&local_60);
          }
          else {
LAB_0013520f:
            QString::operator=(&local_48,(QChar)0x25);
            QString::append((QChar)(char16_t)&local_48);
          }
        }
        else if (cVar2 == L'f') {
          QString::QString(&local_a8,(QChar)0x22);
          QString::append((QString *)&local_a8);
          local_90 = &(local_a8.d.d)->super_QArrayData;
          local_88 = local_a8.d.ptr;
          qStack_80 = local_a8.d.size;
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QString::append((QChar)(char16_t)&local_90);
          QString::operator=(&local_48,(QString *)&local_90);
          if (local_90 != (QArrayData *)0x0) {
            LOCK();
            (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_90,2,8);
            }
          }
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            iVar1 = ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
            UNLOCK();
            pQVar4 = &(local_a8.d.d)->super_QArrayData;
joined_r0x001352bc:
            if (iVar1 == 0) {
              QArrayData::deallocate(pQVar4,2,8);
            }
          }
        }
        else {
          if (cVar2 != L'n') goto LAB_0013520f;
          FileName::FileName(&local_60,file);
          local_78 = &(local_60.super_QString.d.d)->super_QArrayData;
          local_70 = local_60.super_QString.d.ptr;
          qStack_68 = local_60.super_QString.d.size;
          if (&(local_60.super_QString.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_60.super_QString.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i = ((local_60.super_QString.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QString::QString(&local_a8,(QChar)0x22);
          QString::append((QString *)&local_a8);
          local_90 = &(local_a8.d.d)->super_QArrayData;
          local_88 = local_a8.d.ptr;
          qStack_80 = local_a8.d.size;
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QString::append((QChar)(char16_t)&local_90);
          QString::operator=(&local_48,(QString *)&local_90);
          if (local_90 != (QArrayData *)0x0) {
            LOCK();
            (local_90->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_90->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_90->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_90,2,8);
            }
          }
          if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_78 != (QArrayData *)0x0) {
            LOCK();
            (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_78,2,8);
            }
          }
          if (&(local_60.super_QString.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_60.super_QString.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i = ((local_60.super_QString.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            iVar1 = ((local_60.super_QString.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i;
            UNLOCK();
            pQVar4 = &(local_60.super_QString.d.d)->super_QArrayData;
            goto joined_r0x001352bc;
          }
        }
        QString::append((QString *)__return_storage_ptr__);
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
          }
        }
        iVar7 = iVar7 + 1;
      }
      else {
        QString::append((QChar)(char16_t)__return_storage_ptr__);
      }
      iVar7 = iVar7 + 1;
      lVar6 = (long)iVar7;
      lVar5 = (pre->d).size;
    } while (lVar6 < lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

QString UnixUtils::substituteFileBrowserParameters(const QString &pre, const QString &file)
{
    QString cmd;
    for (int i = 0; i < pre.size(); ++i) {
        QChar c = pre.at(i);
        if (c == QLatin1Char('%') && i < pre.size()-1) {
            c = pre.at(++i);
            QString s;
            if (c == QLatin1Char('d')) {
                s = QLatin1Char('"') + QFileInfo(file).path() + QLatin1Char('"');
            } else if (c == QLatin1Char('f')) {
                s = QLatin1Char('"') + file + QLatin1Char('"');
            } else if (c == QLatin1Char('n')) {
                s = QLatin1Char('"') + FileName::fromString(file).fileName() + QLatin1Char('"');
            } else if (c == QLatin1Char('%')) {
                s = c;
            } else {
                s = QLatin1Char('%');
                s += c;
            }
            cmd += s;
            continue;
        }
        cmd += c;
    }
    return cmd;
}